

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O3

double __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::operator()
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,double d0,...)

{
  char in_AL;
  undefined8 *puVar1;
  undefined8 in_RCX;
  uint uVar2;
  undefined8 in_RDX;
  ulong uVar3;
  undefined8 in_RSI;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  double extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  double *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  double *local_d0;
  double *local_c8;
  double local_b8 [4];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_b8[1] = (double)in_RSI;
  local_b8[2] = (double)in_RDX;
  local_b8[3] = (double)in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  local_e8 = (double *)malloc(0x18);
  if (((ulong)local_e8 & 0xf) == 0) {
    if (local_e8 == (double *)0x0) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = std::ios::widen;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_e0 = 3;
    *local_e8 = d0;
    local_d8 = 0x4000000008;
    local_c8 = local_b8;
    pdVar5 = (double *)&stack0x00000008;
    uVar3 = 0x40;
    lVar4 = 0;
    local_d0 = pdVar5;
    while( true ) {
      if ((uint)uVar3 < 0xa1) {
        pdVar6 = (double *)((long)local_c8 + uVar3);
        uVar2 = (uint)uVar3 + 0x10;
        uVar3 = (ulong)uVar2;
        local_d8 = CONCAT44(uVar2,(undefined4)local_d8);
      }
      else {
        local_d0 = pdVar5 + 1;
        pdVar6 = pdVar5;
        pdVar5 = local_d0;
      }
      if (lVar4 == 2) break;
      local_e8[lVar4 + 1] = *pdVar6;
      lVar4 = lVar4 + 1;
      if (lVar4 == 2) {
        (*(this->super_function)._vptr_function[3])(this,&local_e8);
        free(local_e8);
        return extraout_XMM0_Qa;
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                "void *Eigen::internal::aligned_malloc(std::size_t)");
}

Assistant:

virtual const double operator()(double d0, ...) const {
            va_list vl;
            vector V(N);
            V[0] = d0;

            va_start(vl, d0);
            for(unsigned int i = 1; i < N; i++) {
                V[i] = va_arg(vl, double);
            }
            va_end(vl);

            return (*this)(V);
        }